

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

QString * fileArchitecture(QString *__return_storage_ptr__,Options *options,QString *path)

{
  long lVar1;
  Span *pSVar2;
  FILE *pFVar3;
  UP __stream;
  Data *pDVar4;
  char16_t *pcVar5;
  Data *pDVar6;
  char cVar7;
  bool bVar8;
  longlong __old_val;
  char *pcVar9;
  size_t size;
  qsizetype qVar10;
  ulong uVar11;
  undefined8 *puVar12;
  long in_FS_OFFSET;
  QByteArrayView bv;
  QAnyStringView QVar13;
  const_iterator cVar14;
  QArrayDataPointer<char16_t> local_308;
  QArrayDataPointer<char16_t> local_2f0;
  UP readElfCommand;
  char16_t *pcStack_2d0;
  qsizetype local_2c8;
  QArrayDataPointer<char16_t> local_2b8;
  QArrayDataPointer<char16_t> local_298;
  QArrayDataPointer<char> local_278;
  QArrayDataPointer<char> local_258;
  char buffer [512];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_298.size = -0x5555555555555556;
  local_298.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_298.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  architectureFromName((QString *)&local_298,path);
  qVar10 = local_298.size;
  pcVar5 = local_298.ptr;
  pDVar4 = local_298.d;
  if (local_298.size == 0) {
    local_2b8.size = -0x5555555555555556;
    local_2b8.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_2b8.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
    llvmReadobjPath((QString *)&local_2b8,options);
    cVar7 = QFile::exists((QString *)&local_2b8);
    pFVar3 = _stderr;
    if (cVar7 == '\0') {
      QString::toLocal8Bit((QByteArray *)buffer,(QString *)&local_2b8);
      puVar12 = (undefined8 *)buffer._8_8_;
      if (buffer._8_8_ == 0) {
        puVar12 = &QByteArray::_empty;
      }
      fprintf(pFVar3,"Command does not exist: %s\n",puVar12);
      QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)buffer);
      (__return_storage_ptr__->d).d = (Data *)0x0;
      (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
      (__return_storage_ptr__->d).size = 0;
    }
    else {
      shellQuote((QString *)&local_2f0,(QString *)&local_2b8);
      shellQuote((QString *)&local_308,path);
      local_258.size = local_2f0.size | 0x8000000000000000;
      buffer._0_8_ = &local_258;
      local_258.d = (Data *)CONCAT71(local_258.d._1_7_,1);
      local_258.ptr = (char *)local_2f0.ptr;
      local_278.size = local_308.size | 0x8000000000000000;
      buffer._8_8_ = &local_278;
      local_278.d = (Data *)CONCAT71(local_278.d._1_7_,1);
      local_278.ptr = (char *)local_308.ptr;
      buffer[0x10] = '\0';
      buffer[0x11] = '\0';
      buffer[0x12] = '\0';
      buffer[0x13] = '\0';
      buffer[0x14] = '\0';
      buffer[0x15] = '\0';
      buffer[0x16] = '\0';
      buffer[0x17] = '\0';
      QVar13.m_size = (size_t)"%1 --needed-libs %2";
      QVar13.field_0.m_data = &readElfCommand;
      QtPrivate::argToQString(QVar13,0x4000000000000013,(ArgBase **)0x2);
      pDVar4 = local_2b8.d;
      local_2b8.d = (Data *)readElfCommand._M_t.super___uniq_ptr_impl<_IO_FILE,_Closer>._M_t.
                            super__Tuple_impl<0UL,__IO_FILE_*,_Closer>.
                            super__Head_base<0UL,__IO_FILE_*,_false>._M_head_impl;
      local_2b8.ptr = pcStack_2d0;
      readElfCommand._M_t.super___uniq_ptr_impl<_IO_FILE,_Closer>._M_t.
      super__Tuple_impl<0UL,__IO_FILE_*,_Closer>.super__Head_base<0UL,__IO_FILE_*,_false>.
      _M_head_impl = (__uniq_ptr_data<_IO_FILE,_Closer,_true,_true>)
                     (__uniq_ptr_data<_IO_FILE,_Closer,_true,_true>)pDVar4;
      local_2b8.size = local_2c8;
      QArrayDataPointer<char16_t>::~QArrayDataPointer
                ((QArrayDataPointer<char16_t> *)&readElfCommand);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_308);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_2f0);
      readElfCommand._M_t.super___uniq_ptr_impl<_IO_FILE,_Closer>._M_t.
      super__Tuple_impl<0UL,__IO_FILE_*,_Closer>.super__Head_base<0UL,__IO_FILE_*,_false>.
      _M_head_impl = (__uniq_ptr_data<_IO_FILE,_Closer,_true,_true>)
                     (__uniq_ptr_impl<_IO_FILE,_Closer>)0xaaaaaaaaaaaaaaaa;
      openProcess((QString *)&readElfCommand);
      __stream = readElfCommand;
      pFVar3 = _stderr;
      if ((__uniq_ptr_impl<_IO_FILE,_Closer>)
          readElfCommand._M_t.super___uniq_ptr_impl<_IO_FILE,_Closer>._M_t.
          super__Tuple_impl<0UL,__IO_FILE_*,_Closer>.super__Head_base<0UL,__IO_FILE_*,_false>.
          _M_head_impl == (__uniq_ptr_impl<_IO_FILE,_Closer>)0x0) {
        QString::toLocal8Bit((QByteArray *)buffer,(QString *)&local_2b8);
        puVar12 = (undefined8 *)buffer._8_8_;
        if (buffer._8_8_ == 0) {
          puVar12 = &QByteArray::_empty;
        }
        fprintf(pFVar3,"Cannot execute command %s\n",puVar12);
        QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)buffer);
      }
      else {
        memset(buffer,0xaa,0x200);
        while (pcVar9 = fgets(buffer,0x200,
                              (FILE *)__stream._M_t.super___uniq_ptr_impl<_IO_FILE,_Closer>._M_t.
                                      super__Tuple_impl<0UL,__IO_FILE_*,_Closer>.
                                      super__Head_base<0UL,__IO_FILE_*,_false>._M_head_impl),
              pcVar9 != (char *)0x0) {
          local_258.size = 0xaaaaaaaaaaaaaaaa;
          local_258.d = (Data *)0xaaaaaaaaaaaaaaaa;
          local_258.ptr = (char *)0xaaaaaaaaaaaaaaaa;
          size = strlen(buffer);
          QByteArray::fromRawData((QByteArray *)&local_258,buffer,size);
          QByteArray::trimmed_helper((QByteArray *)&local_278);
          qVar10 = local_258.size;
          pcVar9 = local_258.ptr;
          pDVar6 = local_258.d;
          local_258.d = local_278.d;
          local_258.ptr = local_278.ptr;
          local_278.d = pDVar6;
          local_278.ptr = pcVar9;
          local_258.size = local_278.size;
          local_278.size = qVar10;
          QArrayDataPointer<char>::~QArrayDataPointer(&local_278);
          qVar10 = QByteArrayView::lengthHelperCharArray("Arch: ",7);
          bv.m_data = "Arch: ";
          bv.m_size = qVar10;
          bVar8 = QByteArray::startsWith((QByteArray *)&local_258,bv);
          if (bVar8) {
            QByteArray::mid((longlong)&local_278,(longlong)&local_258);
            cVar14 = QHash<QByteArray,_QByteArray>::constFindImpl<QByteArray>
                               (&elfArchitectures,(QByteArray *)&local_278);
            QArrayDataPointer<char>::~QArrayDataPointer(&local_278);
            if (cVar14.i.d == (Data<QHashPrivate::Node<QByteArray,_QByteArray>_> *)0x0 &&
                cVar14.i.bucket == 0) {
              (__return_storage_ptr__->d).d = (Data *)0x0;
              (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
              (__return_storage_ptr__->d).size = 0;
            }
            else {
              pSVar2 = (cVar14.i.d)->spans;
              uVar11 = cVar14.i.bucket >> 7;
              QString::fromLatin1<void>
                        (__return_storage_ptr__,
                         (QByteArray *)
                         (pSVar2[uVar11].entries
                          [pSVar2[uVar11].offsets[(uint)cVar14.i.bucket & 0x7f]].storage.data + 0x18
                         ));
            }
            QArrayDataPointer<char>::~QArrayDataPointer(&local_258);
            goto LAB_00109977;
          }
          QArrayDataPointer<char>::~QArrayDataPointer(&local_258);
        }
      }
      (__return_storage_ptr__->d).d = (Data *)0x0;
      (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
      (__return_storage_ptr__->d).size = 0;
LAB_00109977:
      std::unique_ptr<_IO_FILE,_Closer>::~unique_ptr(&readElfCommand);
    }
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_2b8);
  }
  else {
    local_298.d = (Data *)0x0;
    local_298.ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).d = pDVar4;
    (__return_storage_ptr__->d).ptr = pcVar5;
    local_298.size = 0;
    (__return_storage_ptr__->d).size = qVar10;
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_298);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QString fileArchitecture(const Options &options, const QString &path)
{
    auto arch = architectureFromName(path);
    if (!arch.isEmpty())
        return arch;

    QString readElf = llvmReadobjPath(options);
    if (!QFile::exists(readElf)) {
        fprintf(stderr, "Command does not exist: %s\n", qPrintable(readElf));
        return {};
    }

    readElf = "%1 --needed-libs %2"_L1.arg(shellQuote(readElf), shellQuote(path));

    auto readElfCommand = openProcess(readElf);
    if (!readElfCommand) {
        fprintf(stderr, "Cannot execute command %s\n", qPrintable(readElf));
        return {};
    }

    char buffer[512];
    while (fgets(buffer, sizeof(buffer), readElfCommand.get()) != nullptr) {
        QByteArray line = QByteArray::fromRawData(buffer, qstrlen(buffer));
        line = line.trimmed();
        if (line.startsWith("Arch: ")) {
            auto it = elfArchitectures.find(line.mid(6));
            return it != elfArchitectures.constEnd() ? QString::fromLatin1(it.value()) : QString{};
        }
    }
    return {};
}